

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

BufferHandle * __thiscall
duckdb::ColumnFetchState::GetOrInsertHandle(ColumnFetchState *this,ColumnSegment *segment)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  BlockHandle *pBVar3;
  BufferManager *pBVar4;
  _Node_iterator_base<std::pair<const_long,_duckdb::BufferHandle>,_false> _Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  __hash_code __code;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_duckdb::BufferHandle>,_false,_false>,_bool>
  pVar9;
  BufferHandle handle;
  BufferHandle local_60;
  _Hash_node_base *local_48;
  BufferHandle local_40;
  
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  local_48 = (_Hash_node_base *)pBVar3->block_id;
  uVar1 = (this->handles)._M_h._M_bucket_count;
  uVar6 = (ulong)local_48 % uVar1;
  p_Var7 = (this->handles)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, local_48 != p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, local_48 == p_Var2[1]._M_nxt)) goto LAB_0105f447;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0105f447:
  if (p_Var8 == (__node_base_ptr)0x0) {
    _Var5._M_cur = (__node_type *)0x0;
  }
  else {
    _Var5._M_cur = (__node_type *)p_Var8->_M_nxt;
  }
  if (_Var5._M_cur == (__node_type *)0x0) {
    pBVar4 = BufferManager::GetBufferManager(segment->db);
    (*pBVar4->_vptr_BufferManager[7])(&local_60,pBVar4,&segment->block);
    BufferHandle::BufferHandle(&local_40,&local_60);
    pVar9 = ::std::
            _Hashtable<long,std::pair<long_const,duckdb::BufferHandle>,std::allocator<std::pair<long_const,duckdb::BufferHandle>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<long,duckdb::BufferHandle>>
                      ((_Hashtable<long,std::pair<long_const,duckdb::BufferHandle>,std::allocator<std::pair<long_const,duckdb::BufferHandle>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this,&local_48);
    _Var5._M_cur = (__node_type *)
                   pVar9.first.
                   super__Node_iterator_base<std::pair<const_long,_duckdb::BufferHandle>,_false>.
                   _M_cur;
    BufferHandle::~BufferHandle(&local_40);
    BufferHandle::~BufferHandle(&local_60);
  }
  return (BufferHandle *)
         ((long)&((_Var5._M_cur)->
                 super__Hash_node_value<std::pair<const_long,_duckdb::BufferHandle>,_false>).
                 super__Hash_node_value_base<std::pair<const_long,_duckdb::BufferHandle>_>.
                 _M_storage._M_storage + 8);
}

Assistant:

BufferHandle &ColumnFetchState::GetOrInsertHandle(ColumnSegment &segment) {
	auto primary_id = segment.block->BlockId();

	auto entry = handles.find(primary_id);
	if (entry == handles.end()) {
		// not pinned yet: pin it
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		auto handle = buffer_manager.Pin(segment.block);
		auto pinned_entry = handles.insert(make_pair(primary_id, std::move(handle)));
		return pinned_entry.first->second;
	} else {
		// already pinned: use the pinned handle
		return entry->second;
	}
}